

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
::shiftDown(Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
            *this,size_t idx)

{
  byte bVar1;
  Node *pNVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  uint8_t *puVar6;
  InfoType IVar7;
  long lVar8;
  
  puVar6 = this->mInfo;
  bVar1 = puVar6[idx + 1];
  IVar7 = this->mInfoInc;
  if (IVar7 * 2 <= (uint)bVar1) {
    lVar8 = idx * 0x58 + 0x60;
    do {
      puVar6[idx] = bVar1 - (char)IVar7;
      pNVar2 = this->mKeyVals;
      (pNVar2->mData).second.value.data[lVar8 + -0x70] =
           (pNVar2->mData).second.value.data[lVar8 + -0x18];
      Rml::Variant::operator=
                ((Variant *)(pNVar2[-1].mData.second.value.data + lVar8 + -0x10),
                 (Variant *)((pNVar2->mData).second.value.data + lVar8 + -0x10));
      uVar4 = *(undefined8 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8);
      *(undefined8 *)((pNVar2->mData).second.value.data + lVar8 + -0x40) =
           *(undefined8 *)((pNVar2->mData).second.value.data + lVar8 + 0x18);
      *(undefined8 *)((pNVar2->mData).second.value.data + lVar8 + -0x38) = uVar4;
      *(undefined4 *)((long)(&(pNVar2->mData).second.value + -1) + lVar8) =
           *(undefined4 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8 + 8);
      uVar4 = *(undefined8 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8 + 0x10);
      uVar5 = *(undefined8 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8 + 0x18);
      *(undefined8 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8 + 0x10) = 0;
      *(undefined8 *)((long)(&(pNVar2->mData).second.value + 1) + lVar8 + 0x18) = 0;
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((pNVar2->mData).second.value.data + lVar8 + -0x20);
      *(undefined8 *)((pNVar2->mData).second.value.data + lVar8 + -0x28) = uVar4;
      *(undefined8 *)((pNVar2->mData).second.value.data + lVar8 + -0x20) = uVar5;
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      puVar6 = this->mInfo;
      bVar1 = puVar6[idx + 2];
      IVar7 = this->mInfoInc;
      idx = idx + 1;
      lVar8 = lVar8 + 0x58;
    } while (IVar7 * 2 <= (uint)bVar1);
  }
  puVar6[idx] = '\0';
  pNVar2 = this->mKeyVals;
  p_Var3 = pNVar2[idx].mData.second.source.
           super___shared_ptr<const_Rml::PropertySource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  Rml::Variant::~Variant(&pNVar2[idx].mData.second.value);
  return;
}

Assistant:

void shiftDown(size_t idx) noexcept(std::is_nothrow_move_assignable<Node>::value) {
        // until we find one that is either empty or has zero offset.
        // TODO(martinus) we don't need to move everything, just the last one for the same
        // bucket.
        mKeyVals[idx].destroy(*this);

        // until we find one that is either empty or has zero offset.
        while (mInfo[idx + 1] >= 2 * mInfoInc) {
            ROBIN_HOOD_COUNT(shiftDown)
            mInfo[idx] = static_cast<uint8_t>(mInfo[idx + 1] - mInfoInc);
            mKeyVals[idx] = std::move(mKeyVals[idx + 1]);
            ++idx;
        }

        mInfo[idx] = 0;
        // don't destroy, we've moved it
        // mKeyVals[idx].destroy(*this);
        mKeyVals[idx].~Node();
    }